

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

int doloot(void)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  obj *poVar8;
  permonst *ptr;
  monst *pmVar9;
  int iVar10;
  obj **obj;
  xchar xVar11;
  long lVar12;
  int i;
  char *pcVar13;
  void *__ptr;
  char *line;
  int j;
  int x;
  uint uVar14;
  xchar xVar15;
  bool bVar16;
  coord cc;
  boolean prev_loot;
  int prev_inquiry;
  object_pick *lootlist;
  coord local_47;
  boolean local_45;
  int local_44;
  object_pick *local_40;
  d_level *local_38;
  
  local_44 = 0;
  local_45 = '\0';
  uVar14 = 0;
  bVar2 = check_capacity((char *)0x0);
  if (bVar2 == '\0') {
    if (((youmonst.data)->mflags1 & 0x2000) == 0) {
      local_47.x = u.ux;
      local_47.y = u.uy;
      iVar6 = -1;
      local_38 = &u.uz;
      uVar14 = 0;
      xVar15 = u.uy;
      xVar11 = u.ux;
LAB_002140ad:
      x = (int)xVar11;
      iVar10 = (int)xVar15;
      iVar3 = container_at(x,iVar10,'\x01');
      if (iVar3 == 0) {
        if (u.uprops[0x1c].intrinsic == 0) {
          if (level->locations[x][iVar10].typ == ' ') {
            pline("You need to dig up the grave to effectively loot it...");
          }
        }
        else {
          obj = &invent;
          do {
            obj = &((obj *)obj)->nobj->nobj;
            if ((obj *)obj == (obj *)0x0) goto LAB_002144c9;
          } while (((obj *)obj)->oclass != '\f');
          iVar3 = ((obj *)obj)->quan;
          if (0x7ffe < ((obj *)obj)->quan) {
            iVar3 = 0x7fff;
          }
          uVar14 = mt_random();
          uVar14 = SUB164(ZEXT416(uVar14) % SEXT816((long)iVar3),0) + 1;
          if ((int)uVar14 < ((obj *)obj)->quan) {
            obj = &splitobj((obj *)obj,(ulong)uVar14)->nobj;
          }
          freeinv((obj *)obj);
          if (level->locations[u.ux][u.uy].typ == '\x1d') {
            poVar8 = level->objlist;
            iVar3 = 2;
            do {
              for (; poVar8 != (obj *)0x0; poVar8 = poVar8->nobj) {
                if (((ushort)(poVar8->otyp - 0xdbU) < 2) && (iVar3 == poVar8->spe)) {
                  verbalize("Thank you for your contribution to reduce the debt.");
                  add_to_container(poVar8,(obj *)obj);
                  uVar14 = weight(poVar8);
                  poVar8->owt = uVar14;
                  goto LAB_002144c0;
                }
              }
              bVar16 = iVar3 != 0;
              poVar8 = level->objlist;
              iVar3 = iVar3 + -2;
            } while (bVar16);
            ptr = courtmon(local_38);
            pmVar9 = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
            if (pmVar9 == (monst *)0x0) {
              dropy((obj *)obj);
LAB_002144c0:
              uVar14 = 1;
            }
            else {
              add_to_minv(pmVar9,(obj *)obj);
              pline("The exchequer accepts your contribution.");
              uVar4 = mt_random();
              uVar14 = 1;
              if ((uVar4 * -0x3d70a3d7 >> 1 | (uint)((uVar4 * -0x3d70a3d7 & 1) != 0) << 0x1f) <
                  0x51eb852) {
                level->locations[u.ux][u.uy].typ = '\x19';
                pline("The throne vanishes in a puff of logic.");
                newsym((int)u.ux,(int)u.uy);
              }
            }
          }
          else {
            dropy((obj *)obj);
            pline("Ok, now there is loot here.");
            uVar14 = 1;
          }
        }
      }
      else {
        bVar2 = able_to_loot(x,iVar10,"loot");
        if (bVar2 == '\0') {
          return 0;
        }
        uVar4 = query_objlist("Loot which containers?",level->objects[local_47.x][local_47.y],
                              (uint)(level->locations[local_47.x][local_47.y].typ == '\x1e') * 0x80
                              + (uint)(iflags.paranoid_loot == '\0') * 2 + 0x21,&local_40,2,
                              Is_container_func);
        if ((int)uVar4 < 0) {
          return 0;
        }
        if (uVar4 == 0) {
          iVar6 = 0x6e;
        }
        else {
          __ptr = (void *)CONCAT71(local_40._1_7_,(char)local_40);
          lVar12 = 0;
          do {
            poVar8 = *(obj **)((long)__ptr + lVar12);
            if (poVar8 == &zeroobj) {
              pline("You carefully open the magic chest...");
              poVar8 = &zeroobj;
LAB_002141eb:
              uVar5 = use_container(poVar8,0);
              if (multi < 0) {
LAB_002145d6:
                free(__ptr);
                return 1;
              }
              uVar14 = uVar14 | uVar5;
            }
            else {
              if ((poVar8->field_0x4b & 0x20) == 0) {
                if ((poVar8->otyp == 0xe1) && ('\0' < poVar8->spe)) {
                  pline("You carefully open the bag...");
                  pcVar7 = "teeth and bites";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar7 = "lips and kisses";
                    }
                    else {
                      bVar2 = dmgtype(youmonst.data,0x24);
                      pcVar7 = "teeth and bites";
                      if (bVar2 == '\0') {
                        pcVar7 = "lips and kisses";
                      }
                    }
                  }
                  pline("It develops a huge set of %s you!",pcVar7);
                  uVar4 = mt_random();
                  uVar14 = uVar4 % 10 + 2 >> 1;
                  if (u.uprops[0x33].extrinsic == 0 && u.uprops[0x33].intrinsic == 0) {
                    uVar14 = uVar4 % 10 + 1;
                  }
                  pcVar7 = "carnivorous bag";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar7 = "amorous bag";
                    }
                    else {
                      bVar2 = dmgtype(youmonst.data,0x24);
                      pcVar7 = "carnivorous bag";
                      if (bVar2 == '\0') {
                        pcVar7 = "amorous bag";
                      }
                    }
                  }
                  losehp(uVar14,pcVar7,0);
                  discover_object(0xe1,'\x01','\x01');
                  free(__ptr);
                  return 1;
                }
                pcVar7 = xname(poVar8);
                the(pcVar7);
                pline("You carefully open %s...");
                goto LAB_002141eb;
              }
              pline("Hmmm, it seems to be locked.");
              if (flags.autounlock != '\0') {
                iVar6 = 0xf2;
                if (poVar8->otyp == 0xdc) {
LAB_00214241:
                  poVar8 = carrying(iVar6);
                  if (poVar8 == (obj *)0x0) goto LAB_00214205;
                }
                else {
                  poVar8 = carrying(0xe2);
                  if ((poVar8 == (obj *)0x0) && (poVar8 = carrying(0xe3), poVar8 == (obj *)0x0)) {
                    iVar6 = 0xe4;
                    goto LAB_00214241;
                  }
                }
                iVar6 = pick_lock(poVar8,(int)local_47.x,(int)local_47.y,'\x01','\x01');
                if (iVar6 != 0) {
                  __ptr = (void *)CONCAT71(local_40._1_7_,(char)local_40);
                  goto LAB_002145d6;
                }
              }
            }
LAB_00214205:
            lVar12 = lVar12 + 0x10;
          } while ((ulong)uVar4 << 4 != lVar12);
          free((void *)CONCAT71(local_40._1_7_,(char)local_40));
          iVar6 = 0x79;
        }
      }
LAB_002144c9:
      if (iVar6 == 0x79) {
        return uVar14;
      }
      iVar3 = -1;
      do {
        iVar10 = -1;
        do {
          if ((((uint)(u.uy + iVar10) < 0x15 && (iVar3 + u.ux) - 1U < 0x4f) &&
              (pmVar9 = level->monsters[(uint)(iVar3 + u.ux)][(uint)(u.uy + iVar10)],
              pmVar9 != (monst *)0x0)) && ((pmVar9->field_0x61 & 2) == 0)) {
            iVar3 = get_adjacent_loc("Loot in what direction?","Invalid loot location",u.ux,u.uy,
                                     &local_47,(schar *)&local_40);
            xVar15 = local_47.y;
            xVar11 = local_47.x;
            if (iVar3 == 0) {
              return uVar14;
            }
            iVar3 = (int)local_47.x;
            bVar16 = true;
            if ((local_47.x == u.ux) && (local_47.y == u.uy)) {
              bVar16 = false;
              iVar10 = container_at(iVar3,(int)local_47.y,'\0');
              if (iVar10 != 0) goto LAB_002140ad;
            }
            if ((char)local_40 < '\0') {
              pcVar7 = ceiling(iVar3,(int)local_47.y);
              pline("You %s to loot on the %s.","don\'t find anything",pcVar7);
              return 1;
            }
            pmVar9 = level->monsters[xVar11][local_47.y];
            bVar1 = true;
            if ((pmVar9 == (monst *)0x0) || ((pmVar9->field_0x61 & 2) != 0)) {
              pmVar9 = (monst *)0x0;
            }
            else {
              uVar14 = loot_mon(pmVar9,&local_44,&local_45);
              bVar1 = false;
            }
            if (!bVar16) {
              return uVar14;
            }
            iVar6 = container_at((int)local_47.x,(int)local_47.y,'\0');
            if (iVar6 == 0) {
              pcVar7 = "";
              if (local_45 != '\0') {
                pcVar7 = "else ";
              }
              if (local_44 != 0) {
                pcVar7 = "else ";
              }
              line = "You %s %sthere to loot.";
              pcVar13 = "don\'t find anything";
            }
            else {
              if (bVar1) {
                pcVar7 = "You have to be at a container to loot it.";
                goto LAB_002145ca;
              }
              pcVar13 = "else ";
              if (local_44 == 0) {
                pcVar13 = "";
              }
              pcVar7 = mon_nam(pmVar9);
              line = "You can\'t loot anything %sthere with %s in the way.";
            }
            goto LAB_0021488f;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != 2);
        iVar3 = iVar3 + 1;
        if (iVar3 == 2) {
          if (iVar6 == 0x6e) {
            return uVar14;
          }
          if (iVar6 == 0x79) {
            return uVar14;
          }
          line = "You %s %s to loot.";
          pcVar13 = "don\'t find anything";
          pcVar7 = "here";
LAB_0021488f:
          pline(line,pcVar13,pcVar7);
          return uVar14;
        }
      } while( true );
    }
    pcVar7 = "You have no hands!";
    uVar14 = 0;
LAB_002145ca:
    pline(pcVar7);
  }
  return uVar14;
}

Assistant:

int doloot(void)
{
    struct obj *cobj, *pobj;
    int c = -1;
    int timepassed = 0;
    coord cc;
    boolean underfoot = TRUE;
    const char *dont_find_anything = "don't find anything";
    struct monst *mtmp;
    int prev_inquiry = 0;
    boolean prev_loot = FALSE;
    int container_count = 0;

    if (check_capacity(NULL)) {
	/* "Can't do that while carrying so much stuff." */
	return 0;
    }
    if (nohands(youmonst.data)) {
	pline("You have no hands!");	/* not `body_part(HAND)' */
	return 0;
    }
    cc.x = u.ux; cc.y = u.uy;

lootcont:

    if ((container_count = container_at(cc.x, cc.y, TRUE))) {
	struct object_pick *lootlist;
	int i, n;
	int qflags;

	if (!able_to_loot(cc.x, cc.y, "loot")) return 0;

	qflags = BY_NEXTHERE|SIGNAL_ESCAPE;
	if (!iflags.paranoid_loot)
	    qflags |= AUTOSELECT_SINGLE;
	if (IS_MAGIC_CHEST(level->locations[cc.x][cc.y].typ))
	    qflags |= SHOW_MAGIC_CHEST;
	n = query_objlist("Loot which containers?", level->objects[cc.x][cc.y],
			  qflags, &lootlist, PICK_ANY, Is_container_func);

	if (n < 0) {
	    return 0;
	} else if (n == 0) {
	    c = 'n';
	} else if (n > 0) {
	    c = 'y';
	    for (i = 0; i < n; i++) {
		cobj = lootlist[i].obj;
		if (!cobj_is_magic_chest(cobj) && cobj->olocked) {
		    pline("Hmmm, it seems to be locked.");
		    if (flags.autounlock) {
			pobj = NULL;
			if (cobj->otyp == IRON_SAFE) {
			    pobj = carrying(STETHOSCOPE);
			} else {
			    pobj = carrying(SKELETON_KEY);
			    if (!pobj) pobj = carrying(LOCK_PICK);
			    if (!pobj) pobj = carrying(CREDIT_CARD);
			}
			if (pobj) {
			    if (pick_lock(pobj, cc.x, cc.y, TRUE, TRUE)) {
				/* Non-zero return technically only means it
				 * took time, but it also conveniently means
				 * that unlocking is beginning to take place,
				 * so duck out of this container loop in that
				 * case. */
				free(lootlist);
				return 1;
			    }
			}
		    }
		    continue;
		}
		if (!cobj_is_magic_chest(cobj) &&
			cobj->otyp == BAG_OF_TRICKS && cobj->spe > 0) {
		    int tmp;
		    pline("You carefully open the bag...");
		    pline("It develops a huge set of %s you!",
			  Hallucination ? "lips and kisses" : "teeth and bites");
		    tmp = rnd(10);
		    if (Half_physical_damage) tmp = (tmp+1) / 2;
		    losehp(tmp, Hallucination ? "amorous bag" : "carnivorous bag",
			   KILLED_BY_AN);
		    makeknown(BAG_OF_TRICKS);
		    free(lootlist);
		    return 1;
		}

		if (cobj_is_magic_chest(cobj))
		    pline("You carefully open the magic chest...");
		else
		    pline("You carefully open %s...", the(xname(cobj)));
		timepassed |= use_container(cobj, 0);
		if (multi < 0) {
		    /* container trap or BoHsplosion */
		    free(lootlist);
		    return 1;
		}
	    }
	    free(lootlist);
	}
    } else if (Confusion) {
	struct obj *goldob;
	/* Find a money object to mess with */
	for (goldob = invent; goldob; goldob = goldob->nobj) {
	    if (goldob->oclass == COIN_CLASS) break;
	}
	if (goldob){
	    long contribution = rnd((int)min(LARGEST_INT, goldob->quan));
	    if (contribution < goldob->quan)
		goldob = splitobj(goldob, contribution);
	    freeinv(goldob);

	    if (IS_THRONE(level->locations[u.ux][u.uy].typ)){
		struct obj *coffers;
		int pass;
		/* find the original coffers chest, or any chest */
		for (pass = 2; pass > -1; pass -= 2)
		    for (coffers = level->objlist; coffers; coffers = coffers->nobj)
			if ((coffers->otyp == CHEST || coffers->otyp == IRON_SAFE) && coffers->spe == pass)
			    goto gotit;	/* two level break */
gotit:
		if (coffers) {
	    verbalize("Thank you for your contribution to reduce the debt.");
		    add_to_container(coffers, goldob);
		    coffers->owt = weight(coffers);
		} else {
		    struct monst *mon = makemon(courtmon(&u.uz), level,
					    u.ux, u.uy, NO_MM_FLAGS);
		    if (mon) {
			add_to_minv(mon, goldob);
			pline("The exchequer accepts your contribution.");
			if (!rn2(50)) {
			    level->locations[u.ux][u.uy].typ = ROOM;
			    pline("The throne vanishes in a puff of logic.");
			    newsym(u.ux,u.uy);
			}
		    } else {
			dropy(goldob);
		    }
		}
	    } else {
		dropy(goldob);
		pline("Ok, now there is loot here.");
	    }
	    timepassed = 1;
	}
    } else if (IS_GRAVE(level->locations[cc.x][cc.y].typ)) {
	pline("You need to dig up the grave to effectively loot it...");
    }
    /*
     * 3.3.1 introduced directional looting for some things.
     */
    if (c != 'y' && mon_beside(u.ux, u.uy)) {
	schar dz;
	if (!get_adjacent_loc("Loot in what direction?", "Invalid loot location",
			u.ux, u.uy, &cc, &dz))
	    return timepassed;
	if (cc.x == u.ux && cc.y == u.uy) {
	    underfoot = TRUE;
	    if (container_at(cc.x, cc.y, FALSE))
		goto lootcont;
	} else
	    underfoot = FALSE;
	if (dz < 0) {
	    pline("You %s to loot on the %s.", dont_find_anything,
		ceiling(cc.x, cc.y));
	    timepassed = 1;
	    return timepassed;
	}
	mtmp = m_at(level, cc.x, cc.y);
	if (mtmp) timepassed = loot_mon(mtmp, &prev_inquiry, &prev_loot);

	/* Preserve pre-3.3.1 behaviour for containers.
	 * Adjust this if-block to allow container looting
	 * from one square away to change that in the future.
	 */
	if (!underfoot) {
	    if (container_at(cc.x, cc.y, FALSE)) {
		if (mtmp) {
		    pline("You can't loot anything %sthere with %s in the way.",
			    prev_inquiry ? "else " : "", mon_nam(mtmp));
		    return timepassed;
		} else {
		    pline("You have to be at a container to loot it.");
		}
	    } else {
		pline("You %s %sthere to loot.", dont_find_anything,
			(prev_inquiry || prev_loot) ? "else " : "");
		return timepassed;
	    }
	}
    } else if (c != 'y' && c != 'n') {
	pline("You %s %s to loot.", dont_find_anything,
		    underfoot ? "here" : "there");
    }
    return timepassed;
}